

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::nextobj(uint argc)

{
  vm_val_t *pvVar1;
  
  CVmBif::check_argc_range(argc,1,3);
  if (sp_[-1].typ == VM_OBJ) {
    pvVar1 = sp_ + -1;
    sp_ = sp_ + -1;
    enum_objects(argc - 1,(pvVar1->val).obj + 1);
    return;
  }
  sp_ = sp_ + -1;
  err_throw(0x7da);
}

Assistant:

void CVmBifTADS::nextobj(VMG_ uint argc)
{
    vm_val_t val;
    vm_obj_id_t prv_obj;

    /* check arguments */
    check_argc_range(vmg_ argc, 1, 3);

    /* get the previous object */
    G_interpreter->pop_obj(vmg_ &val);
    prv_obj = val.val.obj;

    /* 
     *   Enumerate objects starting with the next object in the master
     *   object table after the given object.  Reduce the argument count by
     *   one, since we've removed the preceding object.  
     */
    enum_objects(vmg_ argc - 1, prv_obj + 1);
}

/* enum_objects flags */
#define VMBIFTADS_ENUM_INSTANCES  0x0001
#define VMBIFTADS_ENUM_CLASSES    0x0002

/*
 *   Common handler for firstobj/nextobj object iteration
 */
void CVmBifTADS::enum_objects(VMG_ uint argc, vm_obj_id_t start_obj)
{
    vm_val_t val;
    vm_obj_id_t sc;
    vm_obj_id_t obj;
    unsigned long flags;

    /* presume no superclass filter will be specified */
    sc = VM_INVALID_OBJ;

    /* presume we're enumerating instances only */
    flags = VMBIFTADS_ENUM_INSTANCES;

    /* 
     *   check arguments - we can optionally have two more arguments: a
     *   superclass whose instances/subclasses we are to enumerate, and an
     *   integer giving flag bits 
     */
    if (argc == 2)
    {
        /* pop the object */
        G_interpreter->pop_obj(vmg_ &val);
        sc = val.val.obj;

        /* pop the flags */
        flags = pop_long_val(vmg0_);
    }
    else if (argc == 1)
    {
        /* check to see if it's an object or the flags integer */
        switch (G_stk->get(0)->typ)
        {
        case VM_INT:
            /* it's the flags */
            flags = pop_long_val(vmg0_);
            break;

        case VM_OBJ:
            /* it's the superclass filter */
            G_interpreter->pop_obj(vmg_ &val);
            sc = val.val.obj;
            break;

        default:
            /* invalid argument type */
            err_throw(VMERR_BAD_TYPE_BIF);
        }
    }

    /* presume we won't find anything */
    retval_nil(vmg0_);

    /* 
     *   starting with the given object, scan objects until we find one
     *   that's valid and matches our superclass, if one was provided 
     */
    for (obj = start_obj ; obj < G_obj_table->get_max_used_obj_id() ; ++obj)
    {
        /* 
         *   If it's valid, and it's not an intrinsic class modifier object,
         *   consider it further.  Skip intrinsic class modifiers, since
         *   they're not really separate objects; they're really part of the
         *   intrinsic class they modify, and all of the properties and
         *   methods of a modifier object are reachable through the base
         *   intrinsic class.  
         */
        if (G_obj_table->is_obj_id_valid(obj)
            && !CVmObjIntClsMod::is_intcls_mod_obj(vmg_ obj))
        {
            /* 
             *   if it's a class, skip it if the flags indicate classes are
             *   not wanted; if it's an instance, skip it if the flags
             *   indicate that instances are not wanted 
             */
            if (vm_objp(vmg_ obj)->is_class_object(vmg_ obj))
            {
                /* it's a class - skip it if classes are not wanted */
                if ((flags & VMBIFTADS_ENUM_CLASSES) == 0)
                    continue;
            }
            else
            {
                /* it's an instance - skip it if instances are not wanted */
                if ((flags & VMBIFTADS_ENUM_INSTANCES) == 0)
                    continue;
            }

            /* 
             *   if a superclass was specified, and it matches, we have a
             *   winner 
             */
            if (sc != VM_INVALID_OBJ)
            {
                /* if the object matches, return it */
                if (vm_objp(vmg_ obj)->is_instance_of(vmg_ sc))
                {
                    retval_obj(vmg_ obj);
                    break;
                }
            }
            else
            {
                /* 
                 *   We're enumerating all objects - but skip List and String
                 *   object, as we expose these as special types.  
                 */
                if (vm_objp(vmg_ obj)->get_as_list() == 0
                    && vm_objp(vmg_ obj)->get_as_string(vmg0_) == 0)
                {
                    retval_obj(vmg_ obj);
                    break;
                }
            }
        }
    }
}

/* ------------------------------------------------------------------------ */
/*
 *   Abstract RNG algorithm interface
 */
class IVmBifTadsRNG
{
public:
    virtual ~IVmBifTadsRNG() { }

    /* get the next random number */
    virtual uint32_t rand() = 0;

    /* seed the generator from random data */
    virtual void seed_random() = 0;

    /* seed from an int */
    virtual void seed_int(int32_t i)
    {
        /* by default, turn this into a string and seed with the string */
        char buf[40];
        oswp4(buf, i);
        t3sprintf(buf+4, sizeof(buf)-4, "%ld", (long)i);
        seed_str(buf, 4 + strlen(buf+4));
    }

    /* seed from a string */
    virtual void seed_str(const char *str, size_t len)
    {
        /* by default, hash the string to an int and seed with the int */
        CVmCRC32 crc;
        crc.scan_bytes(str, len);
        seed_int((int32_t)crc.get_crc_val());
    }

    /* get the state into a ByteArray object */
    void get_state(VMG_ vm_val_t *val)
    {
        size_t len = get_state_size();
        if (len == 0)
        {
            /* simple int32_t state */
            val->set_int(get_state_int());
        }
        else
        {
            /* allocate a buffer */
            char *buf = new char[len];

            /* make sure we delete the allocated buffer */
            err_try
            {
                /* get the state into our buffer */
                get_state_buf(buf);

                /* create a ByteArray from the state vector */
                val->set_obj(CVmObjByteArray::create_from_bytes(
                    vmg_ FALSE, buf, len));
            }
            err_finally
            {
                /* done with the buffer */
                delete [] buf;
            }
            err_end;
        }
    }